

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<true> * __thiscall
TextState<true>::String
          (TextState<true> *this,Context<true> *ctx,char *str,SizeType length,bool param_4)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *str_00;
  char *pcVar4;
  ulong uVar5;
  Namespace<true> *this_00;
  
  this_00 = (ctx->namespace_path).
            super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>._M_impl.
            super__Vector_impl_data._M_finish + -1;
  uVar5 = (ulong)length;
  pcVar1 = str + uVar5;
  pcVar4 = str + 1;
  str_00 = str;
  do {
    if (uVar5 == 0) {
      if (str_00 < pcVar1) {
        Namespace<true>::AddFeature(this_00,ctx->all,str_00);
      }
      return ctx->previous_state;
    }
    cVar2 = pcVar4[-1];
    if (cVar2 == '\t') {
LAB_001986e9:
      pcVar4[-1] = '\0';
      pcVar3 = pcVar4;
      if (str != str_00 && -1 < (long)str - (long)str_00) {
        Namespace<true>::AddFeature(this_00,ctx->all,str_00);
      }
    }
    else {
      pcVar3 = str_00;
      if ((cVar2 == '|') || (cVar2 == ':')) {
        pcVar4[-1] = '_';
      }
      else if (cVar2 == ' ') goto LAB_001986e9;
    }
    pcVar4 = pcVar4 + 1;
    str = str + 1;
    uVar5 = uVar5 - 1;
    str_00 = pcVar3;
  } while( true );
}

Assistant:

BaseState<audit>* String(Context<audit>& ctx, const char* str, rapidjson::SizeType length, bool)
  {
    auto& ns = ctx.CurrentNamespace();

    // split into individual features
    const char* start = str;
    const char* end = str + length;
    for (char* p = (char*)str; p != end; p++)
    {
      switch (*p)
      {
          // split on space and tab
        case ' ':
        case '\t':
          *p = '\0';
          if (p - start > 0)
            ns.AddFeature(ctx.all, start);

          start = p + 1;
          break;
          // escape chars
        case ':':
        case '|':
          *p = '_';
          break;
      }
    }

    if (start < end)
      ns.AddFeature(ctx.all, start);

    return ctx.previous_state;
  }